

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerCPP::emit_interface_block(CompilerCPP *this,SPIRVariable *var)

{
  ID *__k;
  ID *__k_00;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_01;
  uint32_t uVar1;
  Bitset *pBVar2;
  SPIRType *pSVar3;
  mapped_type *pmVar4;
  SPIRType *type;
  bool bVar5;
  char (*ts_7) [3];
  uint32_t location;
  __alloc_node_gen_t __alloc_node_gen;
  __hashtable_alloc local_d0 [16];
  string buffer_name;
  char *lowerqual;
  char *qual;
  string instance_name;
  Bitset flags;
  
  __k = &(var->super_IVariant).self;
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  bVar5 = var->storage == Input;
  qual = "StageOutput";
  if (bVar5) {
    qual = "StageInput";
  }
  lowerqual = "stage_output";
  if (bVar5) {
    lowerqual = "stage_input";
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&instance_name,this,(ulong)(var->super_IVariant).self.id,1);
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,__k);
  location = (pmVar4->decoration).location;
  buffer_name._M_dataplus._M_p = (pointer)&buffer_name.field_2;
  buffer_name._M_string_length = 0;
  buffer_name.field_2._M_local_buf[0] = '\0';
  __k_00 = &(pSVar3->super_IVariant).self;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,__k_00);
  flags.lower = (pmVar4->decoration).decoration_flags.lower;
  this_01 = &flags.higher;
  flags.higher._M_h._M_buckets = (__buckets_ptr)0x0;
  flags.higher._M_h._M_bucket_count =
       (pmVar4->decoration).decoration_flags.higher._M_h._M_bucket_count;
  flags.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  flags.higher._M_h._M_element_count =
       (pmVar4->decoration).decoration_flags.higher._M_h._M_element_count;
  pBVar2 = &(pmVar4->decoration).decoration_flags;
  flags.higher._M_h._M_rehash_policy._M_max_load_factor =
       (pBVar2->higher)._M_h._M_rehash_policy._M_max_load_factor;
  flags.higher._M_h._M_rehash_policy._4_4_ =
       *(undefined4 *)&(pBVar2->higher)._M_h._M_rehash_policy.field_0x4;
  flags.higher._M_h._M_rehash_policy._M_next_resize =
       (pmVar4->decoration).decoration_flags.higher._M_h._M_rehash_policy._M_next_resize;
  flags.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __alloc_node_gen._M_h = (__hashtable_alloc *)this_01;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)this_01,&(pmVar4->decoration).decoration_flags.higher._M_h,&__alloc_node_gen);
  if ((flags.lower & 4) == 0) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (&__alloc_node_gen,this,pSVar3,0);
    ::std::__cxx11::string::operator=((string *)&buffer_name,(string *)&__alloc_node_gen);
    if (__alloc_node_gen._M_h == local_d0) goto LAB_002ad452;
  }
  else {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + __k_00->id);
    (type->type_alias).id = 0;
    CompilerGLSL::emit_struct(&this->super_CompilerGLSL,type);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&__alloc_node_gen,this,(ulong)__k_00->id,1);
    ::std::__cxx11::string::operator=((string *)&buffer_name,(string *)&__alloc_node_gen);
    if (__alloc_node_gen._M_h == local_d0) goto LAB_002ad452;
  }
  operator_delete(__alloc_node_gen._M_h);
LAB_002ad452:
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
            (&__alloc_node_gen,this,pSVar3,(ulong)__k->id);
  CompilerGLSL::
  statement<char_const(&)[11],char_const*&,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [11])"internal::",&qual,(char (*) [2])0x353fcd,
             &buffer_name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__alloc_node_gen,
             (char (*) [3])0x3a318b,&instance_name,(char (*) [4])"__;");
  if (__alloc_node_gen._M_h != local_d0) {
    operator_delete(__alloc_node_gen._M_h);
  }
  uVar1 = (this->super_CompilerGLSL).indent;
  (this->super_CompilerGLSL).indent = 0;
  ts_7 = (char (*) [3])0x2ad4f2;
  CompilerGLSL::
  statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[9]>
            (&this->super_CompilerGLSL,(char (*) [9])"#define ",&instance_name,
             (char (*) [9])" __res->",&instance_name,(char (*) [9])"__.get()");
  (this->super_CompilerGLSL).indent = uVar1;
  join<char_const(&)[12],char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],char_const(&)[3],unsigned_int&,char_const(&)[3]>
            ((string *)&__alloc_node_gen,(spirv_cross *)"s.register_",(char (*) [12])&lowerqual,
             (char **)0x398789,(char (*) [2])&instance_name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38ae75,
             (char (*) [3])0x394b62,(char (*) [3])&location,(uint *)0x3a31d3,ts_7);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(&this->resource_registrations,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__alloc_node_gen
             );
  if (__alloc_node_gen._M_h != local_d0) {
    operator_delete(__alloc_node_gen._M_h);
  }
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x34ea49);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&this_01->_M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buffer_name._M_dataplus._M_p != &buffer_name.field_2) {
    operator_delete(buffer_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)instance_name._M_dataplus._M_p != &instance_name.field_2) {
    operator_delete(instance_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerCPP::emit_interface_block(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);

	const char *qual = var.storage == StorageClassInput ? "StageInput" : "StageOutput";
	const char *lowerqual = var.storage == StorageClassInput ? "stage_input" : "stage_output";
	auto instance_name = to_name(var.self);
	uint32_t location = ir.meta[var.self].decoration.location;

	string buffer_name;
	auto flags = ir.meta[type.self].decoration.decoration_flags;
	if (flags.get(DecorationBlock))
	{
		emit_block_struct(type);
		buffer_name = to_name(type.self);
	}
	else
		buffer_name = type_to_glsl(type);

	statement("internal::", qual, "<", buffer_name, type_to_array_glsl(type, var.self), "> ", instance_name, "__;");
	statement_no_indent("#define ", instance_name, " __res->", instance_name, "__.get()");
	resource_registrations.push_back(join("s.register_", lowerqual, "(", instance_name, "__", ", ", location, ");"));
	statement("");
}